

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O0

int Bmc_EcoPatch(Gia_Man_t *p,int nIns,int nOuts)

{
  int *piVar1;
  Gia_Man_t *p_00;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *pCVar4;
  sat_solver *s;
  Vec_Int_t *p_01;
  Gia_Obj_t *pObj_00;
  bool bVar5;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  Vec_Int_t *vVars;
  Gia_Obj_t *pObj;
  int Root;
  int RetValue;
  int Lit;
  int i;
  int nOuts_local;
  int nIns_local;
  Gia_Man_t *p_local;
  
  Lit = nOuts;
  i = nIns;
  _nOuts_local = p;
  pCVar4 = Cnf_DeriveGiaRemapped(p);
  s = sat_solver_new();
  sat_solver_setnvars(s,pCVar4->nVars);
  for (RetValue = 0; RetValue < pCVar4->nClauses; RetValue = RetValue + 1) {
    iVar2 = sat_solver_addclause(s,pCVar4->pClauses[RetValue],pCVar4->pClauses[RetValue + 1]);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xd6,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
    }
  }
  iVar2 = Gia_ManPoNum(_nOuts_local);
  if (iVar2 != Lit + 1 + i) {
    __assert_fail("Gia_ManPoNum(p) == nOuts + 1 + nIns",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0xd8,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
  }
  RetValue = 0;
  while( true ) {
    iVar2 = RetValue;
    iVar3 = Gia_ManPoNum(_nOuts_local);
    bVar5 = false;
    if (iVar2 < iVar3) {
      vVars = (Vec_Int_t *)Gia_ManCo(_nOuts_local,RetValue);
      bVar5 = vVars != (Vec_Int_t *)0x0;
    }
    if ((!bVar5) || (RetValue == Lit)) break;
    piVar1 = pCVar4->pVarNums;
    iVar2 = Gia_ObjId(_nOuts_local,(Gia_Obj_t *)vVars);
    Root = Abc_Var2Lit(piVar1[iVar2],1);
    iVar2 = sat_solver_addclause(s,&Root,&RetValue);
    if (iVar2 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xdf,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
    }
    RetValue = RetValue + 1;
  }
  vVars = (Vec_Int_t *)Gia_ManPo(_nOuts_local,Lit);
  piVar1 = pCVar4->pVarNums;
  iVar2 = Gia_ObjId(_nOuts_local,(Gia_Obj_t *)vVars);
  Root = Abc_Var2Lit(piVar1[iVar2],0);
  iVar2 = sat_solver_addclause(s,&Root,&RetValue);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0xe5,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
  }
  iVar2 = sat_solver_simplify(s);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0xe8,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
  }
  p_01 = Vec_IntAlloc(i);
  RetValue = 0;
  while( true ) {
    iVar2 = RetValue;
    iVar3 = Gia_ManPoNum(_nOuts_local);
    bVar5 = false;
    if (iVar2 < iVar3) {
      vVars = (Vec_Int_t *)Gia_ManCo(_nOuts_local,RetValue);
      bVar5 = vVars != (Vec_Int_t *)0x0;
    }
    if (!bVar5) break;
    if (Lit + 1 <= RetValue) {
      piVar1 = pCVar4->pVarNums;
      iVar2 = Gia_ObjId(_nOuts_local,(Gia_Obj_t *)vVars);
      Vec_IntPush(p_01,piVar1[iVar2]);
    }
    RetValue = RetValue + 1;
  }
  iVar2 = Vec_IntSize(p_01);
  p_00 = _nOuts_local;
  if (iVar2 != i) {
    __assert_fail("Vec_IntSize(vVars) == nIns",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0xee,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
  }
  iVar2 = Gia_ManPiNum(_nOuts_local);
  pObj_00 = Gia_ManPi(p_00,iVar2 + -1);
  piVar1 = pCVar4->pVarNums;
  iVar2 = Gia_ObjId(_nOuts_local,pObj_00);
  iVar2 = Bmc_EcoSolve(s,piVar1[iVar2],p_01);
  Vec_IntFree(p_01);
  return iVar2;
}

Assistant:

int Bmc_EcoPatch( Gia_Man_t * p, int nIns, int nOuts )
{
    int i, Lit, RetValue, Root;
    Gia_Obj_t * pObj;
    Vec_Int_t * vVars;
    // generate CNF and solver
    Cnf_Dat_t * pCnf = Cnf_DeriveGiaRemapped( p );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // add equality constraints
    assert( Gia_ManPoNum(p) == nOuts + 1 + nIns );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nOuts )
            break;
        Lit = Abc_Var2Lit( pCnf->pVarNums[Gia_ObjId(p, pObj)], 1 ); // neg lit
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue );
    }
    // add inequality constraint
    pObj = Gia_ManPo( p, nOuts );
    Lit = Abc_Var2Lit( pCnf->pVarNums[Gia_ObjId(p, pObj)], 0 ); // pos lit
    RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
    assert( RetValue );
    // simplify the SAT solver
    RetValue = sat_solver_simplify( pSat );
    assert( RetValue );
    // collect input variables
    vVars = Vec_IntAlloc( nIns );
    Gia_ManForEachPo( p, pObj, i )
        if ( i >= nOuts + 1 )
            Vec_IntPush( vVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    assert( Vec_IntSize(vVars) == nIns );
    // derive the root variable
    pObj = Gia_ManPi( p, Gia_ManPiNum(p) - 1 );
    Root = pCnf->pVarNums[Gia_ObjId(p, pObj)];
    // solve the problem
    RetValue = Bmc_EcoSolve( pSat, Root, vVars );
    Vec_IntFree( vVars );
    return RetValue;
}